

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::Property
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,
          PropertyIdIndexType propertyIdIndex,bool forceStrictMode)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  OpLayoutType local_28;
  bool success;
  PropertyIdIndexType local_20;
  RegSlot RStack_1c;
  bool forceStrictMode_local;
  PropertyIdIndexType propertyIdIndex_local;
  RegSlot instance_local;
  RegSlot value_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  success = forceStrictMode;
  local_20 = propertyIdIndex;
  RStack_1c = instance;
  propertyIdIndex_local = value;
  instance_local._2_2_ = op;
  _value_local = this;
  CheckOpen(this);
  op_00 = instance_local._2_2_;
  OpLayoutType::OpLayoutType(&local_28,ElementC);
  CheckOp(this,op_00,local_28);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(instance_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x5e9,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  propertyIdIndex_local = ConsumeReg(this,propertyIdIndex_local);
  RStack_1c = ConsumeReg(this,RStack_1c);
  if ((((1 < (ushort)(instance_local._2_2_ - DeleteFld)) &&
       (instance_local._2_2_ != LdElemUndefScoped)) && (instance_local._2_2_ != StFuncExpr)) &&
     (((1 < (ushort)(instance_local._2_2_ - InitClassMemberSet) &&
       (instance_local._2_2_ != DeleteFld_ReuseLoc)) &&
      ((1 < (ushort)(instance_local._2_2_ - InitSetFld) && (instance_local._2_2_ != InitProto))))))
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x5fe,"(false)",
                                "The specified OpCode is not intended for field-access");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = ParseableFunctionInfo::GetIsStrictMode
                    (&this->m_functionWrite->super_ParseableFunctionInfo);
  if ((bVar2) || ((success & 1U) != 0)) {
    if (instance_local._2_2_ == DeleteFld) {
      instance_local._2_2_ = DeleteFldStrict;
    }
    else if (instance_local._2_2_ == DeleteRootFld) {
      instance_local._2_2_ = DeleteRootFldStrict;
    }
  }
  bVar2 = TryWriteElementC<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,instance_local._2_2_,propertyIdIndex_local,RStack_1c,local_20);
  if (((!bVar2) &&
      (bVar2 = TryWriteElementC<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,instance_local._2_2_,propertyIdIndex_local,RStack_1c,local_20),
      !bVar2)) &&
     (bVar2 = TryWriteElementC<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,instance_local._2_2_,propertyIdIndex_local,RStack_1c,local_20), !bVar2
     )) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x610,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::Property(OpCode op, RegSlot value, RegSlot instance, PropertyIdIndexType propertyIdIndex, bool forceStrictMode)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementC);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);
        instance = ConsumeReg(instance);

#if DBG
        switch (op)
        {
        case OpCode::InitSetFld:
        case OpCode::InitGetFld:
        case OpCode::InitClassMemberGet:
        case OpCode::InitClassMemberSet:
        case OpCode::InitProto:
        case OpCode::DeleteFld:
        case OpCode::DeleteFld_ReuseLoc:
        case OpCode::DeleteRootFld:
        case OpCode::LdElemUndefScoped:
        case OpCode::StFuncExpr:
            break;

        default:
            AssertMsg(false, "The specified OpCode is not intended for field-access");
            break;
        }
#endif

        if (this->m_functionWrite->GetIsStrictMode() || forceStrictMode)
        {
            if (op == OpCode::DeleteFld)
            {
                op = OpCode::DeleteFldStrict;
            }
            else if (op == OpCode::DeleteRootFld)
            {
                // We will reach here when in the language service mode, since in that mode we have skipped that error.
                op = OpCode::DeleteRootFldStrict;
            }
        }

        MULTISIZE_LAYOUT_WRITE(ElementC, op, value, instance, propertyIdIndex);
    }